

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

string * __thiscall
fmt::v7::stringifier::operator()[abi_cxx11_
          (string *__return_storage_ptr__,stringifier *this,handle h)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf_00;
  locale_ref local_2d0;
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  local_2c8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_2b8;
  undefined1 local_2b0 [8];
  format_context format_ctx;
  basic_string_view<char> local_288;
  undefined1 local_278 [8];
  format_parse_context parse_ctx;
  buffer<char> *base;
  allocator<char> local_241;
  undefined1 local_240 [8];
  memory_buffer buf;
  stringifier *this_local;
  handle h_local;
  
  h_local.custom_.value = h.custom_.format;
  this_local = (stringifier *)h.custom_.value;
  buf._528_8_ = this;
  h_local.custom_.format =
       (_func_void_void_ptr_parse_context_ptr_basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_ptr
        *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_240,&local_241);
  std::allocator<char>::~allocator(&local_241);
  parse_ctx._16_8_ = local_240;
  basic_string_view<char>::basic_string_view(&local_288);
  basic_format_parse_context<char,_fmt::v7::detail::error_handler>::basic_format_parse_context
            ((basic_format_parse_context<char,_fmt::v7::detail::error_handler> *)local_278,
             local_288.data_,local_288.size_);
  local_2b8 = std::back_inserter<fmt::v7::detail::buffer<char>>((buffer<char> *)parse_ctx._16_8_);
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  ::basic_format_args(&local_2c8);
  detail::locale_ref::locale_ref(&local_2d0);
  basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::
  basic_format_context
            ((basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
              *)local_2b0,local_2b8,local_2c8,local_2d0);
  basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  ::handle::format((handle *)&this_local,(parse_context_type *)local_278,
                   (basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
                    *)local_2b0);
  to_string<char,500ul>(__return_storage_ptr__,(v7 *)local_240,buf_00);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_240);
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(basic_format_arg<format_context>::handle h) const {
    memory_buffer buf;
    detail::buffer<char>& base = buf;
    format_parse_context parse_ctx({});
    format_context format_ctx(std::back_inserter(base), {}, {});
    h.format(parse_ctx, format_ctx);
    return to_string(buf);
  }